

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Gia_DeriveFormula_rec(Gia_Man_t *pGia,char **ppNamesIn,Vec_Str_t *vStr,int iLit)

{
  char Entry;
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  int fCompl;
  Gia_Obj_t *pObj;
  int iLit_local;
  Vec_Str_t *vStr_local;
  char **ppNamesIn_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  pObj_00 = Gia_ManObj(pGia,iVar1);
  iVar1 = Abc_LitIsCompl(iLit);
  iVar2 = Gia_ObjIsAnd(pObj_00);
  if (iVar2 == 0) {
    if (iVar1 != 0) {
      Vec_StrPush(vStr,'~');
    }
    iVar1 = Gia_ObjCioId(pObj_00);
    Vec_StrPrintF(vStr,"%s",ppNamesIn[iVar1]);
  }
  else {
    Vec_StrPush(vStr,'(');
    iVar2 = Gia_ObjIsMux(pGia,pObj_00);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjFaninLit0p(pGia,pObj_00);
      iVar2 = Abc_LitNotCond(iVar2,iVar1);
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar2);
      iVar2 = Gia_ObjIsXor(pObj_00);
      if (iVar2 == 0) {
        Entry = '&';
        if (iVar1 != 0) {
          Entry = '|';
        }
      }
      else {
        Entry = '^';
      }
      Vec_StrPush(vStr,Entry);
      iVar2 = Gia_ObjFaninLit1p(pGia,pObj_00);
      iVar1 = Abc_LitNotCond(iVar2,iVar1);
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar1);
    }
    else {
      iVar2 = Gia_ObjFaninLit0p(pGia,pObj_00);
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar2);
      Vec_StrPush(vStr,'?');
      iVar2 = Gia_ObjFaninLit1p(pGia,pObj_00);
      iVar2 = Abc_LitNotCond(iVar2,iVar1);
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar2);
      Vec_StrPush(vStr,':');
      iVar2 = Gia_ObjFaninLit2p(pGia,pObj_00);
      iVar1 = Abc_LitNotCond(iVar2,iVar1);
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar1);
    }
    Vec_StrPush(vStr,')');
  }
  return;
}

Assistant:

void Gia_DeriveFormula_rec( Gia_Man_t * pGia, char ** ppNamesIn, Vec_Str_t * vStr, int iLit )
{
    Gia_Obj_t * pObj = Gia_ManObj( pGia, Abc_Lit2Var(iLit) );
    int fCompl = Abc_LitIsCompl(iLit);
    if ( Gia_ObjIsAnd(pObj) )
    {
        Vec_StrPush( vStr, '(' );
        if ( Gia_ObjIsMux(pGia, pObj) )
        {
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Gia_ObjFaninLit0p(pGia, pObj) );
            Vec_StrPush( vStr, '?' );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit1p(pGia, pObj), fCompl ) );
            Vec_StrPush( vStr, ':' );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit2p(pGia, pObj), fCompl ) );
        }
        else
        {
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit0p(pGia, pObj), fCompl ) );
            Vec_StrPush( vStr, (char)(Gia_ObjIsXor(pObj) ? '^' : (char)(fCompl ? '|' : '&')) );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit1p(pGia, pObj), fCompl ) );
        }
        Vec_StrPush( vStr, ')' );
    }
    else
    {
        if ( fCompl ) Vec_StrPush( vStr, '~' );
        Vec_StrPrintF( vStr, "%s", ppNamesIn[Gia_ObjCioId(pObj)] );
    }
}